

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::analysis::Function::IsSameImpl(Function *this,Type *that,IsSameCache *seen)

{
  pointer ppTVar1;
  Type *pTVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t i;
  ulong uVar6;
  long lVar5;
  
  iVar4 = (*that->_vptr_Type[0x22])(that);
  lVar5 = CONCAT44(extraout_var,iVar4);
  if (lVar5 != 0) {
    iVar4 = (*this->return_type_->_vptr_Type[2])
                      (this->return_type_,*(undefined8 *)(lVar5 + 0x28),seen);
    if (((char)iVar4 != '\0') &&
       ((long)(this->param_types_).
              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->param_types_).
              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_start ==
        *(long *)(lVar5 + 0x38) - *(long *)(lVar5 + 0x30))) {
      uVar6 = 0;
      do {
        ppTVar1 = (this->param_types_).
                  super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->param_types_).
                          super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3) <= uVar6)
        {
          bVar3 = Type::HasSameDecorations(&this->super_Type,that);
          return bVar3;
        }
        pTVar2 = ppTVar1[uVar6];
        iVar4 = (*pTVar2->_vptr_Type[2])
                          (pTVar2,*(undefined8 *)(*(long *)(lVar5 + 0x30) + uVar6 * 8),seen);
        uVar6 = uVar6 + 1;
      } while ((char)iVar4 != '\0');
    }
  }
  return false;
}

Assistant:

bool Function::IsSameImpl(const Type* that, IsSameCache* seen) const {
  const Function* ft = that->AsFunction();
  if (!ft) return false;
  if (!return_type_->IsSameImpl(ft->return_type_, seen)) return false;
  if (param_types_.size() != ft->param_types_.size()) return false;
  for (size_t i = 0; i < param_types_.size(); ++i) {
    if (!param_types_[i]->IsSameImpl(ft->param_types_[i], seen)) return false;
  }
  return HasSameDecorations(that);
}